

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall QString::squeeze(QString *this)

{
  ArrayOptions *pAVar1;
  long lVar2;
  Data *pDVar3;
  
  pDVar3 = (this->d).d;
  if (pDVar3 != (Data *)0x0) {
    lVar2 = (this->d).size;
    if ((1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
       (lVar2 < (pDVar3->super_QArrayData).alloc)) {
      ::QString::reallocData((longlong)this,(AllocationOption)lVar2);
      pDVar3 = (this->d).d;
      if (pDVar3 == (Data *)0x0) {
        return;
      }
    }
    if ((pDVar3->super_QArrayData).alloc != 0) {
      pAVar1 = &(pDVar3->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i & 0xfe;
    }
  }
  return;
}

Assistant:

bool needsDetach() const noexcept { return !d || d->needsDetach(); }